

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O1

TypeParameterSymbol * __thiscall
slang::ast::Scope::find<slang::ast::TypeParameterSymbol>(Scope *this,string_view name)

{
  TypeParameterSymbol *pTVar1;
  
  pTVar1 = (TypeParameterSymbol *)find(this,name);
  if (pTVar1 == (TypeParameterSymbol *)0x0) {
    assert::assertFailed
              ("sym",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Scope.h"
               ,0x57,
               "const T &slang::ast::Scope::find(string_view) const [T = slang::ast::TypeParameterSymbol]"
              );
  }
  if ((pTVar1->super_Symbol).kind == TypeParameter) {
    return pTVar1;
  }
  assert::assertFailed
            ("T::isKind(kind)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
             ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::TypeParameterSymbol]");
}

Assistant:

const T& find(string_view name) const {
        const Symbol* sym = find(name);
        ASSERT(sym);
        return sym->as<T>();
    }